

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

value_type *
phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,int>::
new_element<phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>,std::piecewise_construct_t_const&,std::tuple<phmap::priv::NonStandardLayout_const&>,std::tuple<>>
          (Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *alloc,
          piecewise_construct_t *args,tuple<const_phmap::priv::NonStandardLayout_&> *args_1,
          tuple<> *args_2)

{
  pointer ppVar1;
  PairAlloc pair_alloc;
  
  pair_alloc.id_ = alloc->id_;
  ppVar1 = allocator_traits<phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
           ::allocate(&pair_alloc,1);
  std::pair<phmap::priv::NonStandardLayout_const,int>::pair<phmap::priv::NonStandardLayout_const&>
            ((pair<phmap::priv::NonStandardLayout_const,int> *)ppVar1);
  return ppVar1;
}

Assistant:

static value_type* new_element(Allocator* alloc, Args&&... args) {
        using PairAlloc = typename phmap::allocator_traits<
            Allocator>::template rebind_alloc<value_type>;
        PairAlloc pair_alloc(*alloc);
        value_type* res =
            phmap::allocator_traits<PairAlloc>::allocate(pair_alloc, 1);
        phmap::allocator_traits<PairAlloc>::construct(pair_alloc, res,
                                                      std::forward<Args>(args)...);
        return res;
    }